

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Runtime::LogSymbols(Runtime *this,SymbolList *symbolList)

{
  pointer pSVar1;
  uint uVar2;
  uint32_t i;
  uint uVar3;
  uint32_t uVar4;
  const_iterator symbol;
  SymbolListCItr symbol_00;
  bool bVar5;
  String symbolText;
  
  LogWriteLine(Info,"\nSymbols:\n====================");
  symbol_00._M_current =
       (symbolList->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
       _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (symbolList->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  if (symbol_00._M_current != pSVar1) {
    uVar4 = (symbol_00._M_current)->columnNumber;
  }
  symbolText._M_dataplus._M_p = (pointer)&symbolText.field_2;
  symbolText._M_string_length = 0;
  symbolText.field_2._M_local_buf[0] = '\0';
  bVar5 = true;
  uVar2 = 0;
  for (; symbol_00._M_current != pSVar1; symbol_00._M_current = symbol_00._M_current + 1) {
    if (bVar5) {
      for (uVar3 = 1; uVar3 < (symbol_00._M_current)->columnNumber - uVar4; uVar3 = uVar3 + 1) {
        LogWrite(Info," ");
      }
    }
    WriteSymbol(symbol_00,&symbolText);
    LogWrite(Info,symbolText._M_dataplus._M_p);
    bVar5 = (symbol_00._M_current)->type == NewLine;
    uVar2 = uVar2 + bVar5;
    pSVar1 = (symbolList->
             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  LogWrite(Info,"\nLine Count: %i\n\n",(ulong)uVar2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&symbolText);
  return;
}

Assistant:

inline_t void Runtime::LogSymbols(const SymbolList & symbolList) const
	{
		LogWriteLine(LogLevel::Info, "\nSymbols:\n====================");
		bool newLine = true;

		// Store offset of first symbol
		auto offset = 0;
		if (!symbolList.empty())
			offset = symbolList.begin()->columnNumber;

		int lineCount = 0;

		String symbolText;

		// Iterate through the symbol list and write everything to the log
		for (auto symbol = symbolList.begin(); symbol != symbolList.end(); ++symbol)
		{
			// Write indentation at each new line
			if (newLine)
			{
				for (uint32_t i = 1; i < symbol->columnNumber - offset; ++i)
					LogWrite(LogLevel::Info, " ");
				newLine = false;
			}

			// Write out / lot symbols
			WriteSymbol(symbol, symbolText);
			LogWrite(LogLevel::Info, symbolText.c_str());

			// Special handling for newlines
			if (symbol->type == SymbolType::NewLine)
			{
				newLine = true;
				++lineCount;
			}

		}
		LogWrite(LogLevel::Info, "\nLine Count: %i\n\n", lineCount);
	}